

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Try.h
# Opt level: O2

Try<void> * __thiscall async_simple::Try<void>::operator=(Try<void> *this,Try<void> *other)

{
  if (this != other) {
    std::swap<std::__exception_ptr::exception_ptr>(&this->_error,&other->_error);
  }
  return this;
}

Assistant:

Try& operator=(Try&& other) {
        if (this != &other) {
            std::swap(_error, other._error);
        }
        return *this;
    }